

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

void __thiscall Fl_Clock_Output::draw(Fl_Clock_Output *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  Fl_Color FVar2;
  Fl_Boxtype t;
  int iVar3;
  Fl_Color c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_2c;
  int i;
  Fl_Color shadow_color;
  Fl_Color box_color;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Clock_Output *this_local;
  
  uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
  if (uVar1 == '\x01') {
    local_3c = 0x31;
  }
  else {
    local_3c = Fl_Widget::color(&this->super_Fl_Widget);
  }
  FVar2 = fl_color_average(local_3c,0x38,0.5);
  t = Fl_Widget::box(&this->super_Fl_Widget);
  Fl_Widget::draw_box(&this->super_Fl_Widget,t,X,Y,W,H,local_3c);
  fl_push_matrix();
  fl_translate(((double)X + (double)W / 2.0) - 0.5,((double)Y + (double)H / 2.0) - 0.5);
  fl_scale((double)(W + -1) / 28.0,(double)(H + -1) / 28.0);
  uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
  if (uVar1 == '\x01') {
    iVar3 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar3 == 0) {
      c = Fl_Widget::color(&this->super_Fl_Widget);
      local_40 = fl_inactive(c);
    }
    else {
      local_40 = Fl_Widget::color(&this->super_Fl_Widget);
    }
    fl_color(local_40);
    fl_begin_polygon();
    fl_circle(0.0,0.0,14.0);
    fl_end_polygon();
    iVar3 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar3 == 0) {
      local_44 = fl_inactive(0);
    }
    else {
      local_44 = 0;
    }
    fl_color(local_44);
    fl_begin_loop();
    fl_circle(0.0,0.0,14.0);
    fl_end_loop();
  }
  fl_push_matrix();
  fl_translate(0.6,0.6);
  drawhands(this,FVar2,FVar2);
  fl_pop_matrix();
  fl_push_matrix();
  iVar3 = Fl_Widget::active_r(&this->super_Fl_Widget);
  if (iVar3 == 0) {
    local_48 = fl_inactive(0);
  }
  else {
    local_48 = 0;
  }
  fl_color(local_48);
  for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
    if (local_2c == 6) {
      rect(-0.5,9.0,1.0,2.0);
    }
    else if (((local_2c == 3) || (local_2c == 0)) || (local_2c == 9)) {
      rect(-0.5,9.5,1.0,1.0);
    }
    else {
      rect(-0.25,9.5,0.5,1.0);
    }
    fl_rotate(-30.0);
  }
  fl_pop_matrix();
  FVar2 = Fl_Widget::selection_color(&this->super_Fl_Widget);
  drawhands(this,FVar2,0);
  fl_pop_matrix();
  return;
}

Assistant:

void Fl_Clock_Output::draw(int X, int Y, int W, int H) {
  Fl_Color box_color = type()==FL_ROUND_CLOCK ? FL_GRAY : color();
  Fl_Color shadow_color = fl_color_average(box_color, FL_BLACK, 0.5);
  draw_box(box(), X, Y, W, H, box_color);
  fl_push_matrix();
  fl_translate(X+W/2.0-.5, Y+H/2.0-.5);
  fl_scale((W-1)/28.0, (H-1)/28.0);
  if (type() == FL_ROUND_CLOCK) {
    fl_color(active_r() ? color() : fl_inactive(color()));
    fl_begin_polygon(); fl_circle(0,0,14); fl_end_polygon();
    fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop(); fl_circle(0,0,14); fl_end_loop();
  }
  // draw the shadows:
  fl_push_matrix();
  fl_translate(0.60, 0.60);
  drawhands(shadow_color, shadow_color);
  fl_pop_matrix();
  // draw the tick marks:
  fl_push_matrix();
  fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
  for (int i=0; i<12; i++) {
    if (i==6) rect(-0.5, 9, 1, 2);
    else if (i==3 || i==0 || i== 9) rect(-0.5, 9.5, 1, 1);
    else rect(-0.25, 9.5, .5, 1);
    fl_rotate(-30);
  }
  fl_pop_matrix();
  // draw the hands:
  drawhands(selection_color(), FL_FOREGROUND_COLOR); // color was 54
  fl_pop_matrix();
}